

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O3

void Vec_StrPutF(Vec_Str_t *vOut,float Val)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  
  uVar1 = vOut->nSize;
  if (uVar1 == vOut->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar4;
      vOut->nCap = 0x10;
    }
    else {
      sVar3 = (ulong)uVar1 * 2;
      if (vOut->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar3);
      }
      else {
        pcVar4 = (char *)realloc(vOut->pArray,sVar3);
      }
      vOut->pArray = pcVar4;
      vOut->nCap = (int)sVar3;
    }
  }
  else {
    pcVar4 = vOut->pArray;
  }
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  pcVar4[iVar2] = SUB41(Val,0);
  uVar1 = vOut->nSize;
  if (uVar1 == vOut->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar4;
      vOut->nCap = 0x10;
    }
    else {
      sVar3 = (ulong)uVar1 * 2;
      if (vOut->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar3);
      }
      else {
        pcVar4 = (char *)realloc(vOut->pArray,sVar3);
      }
      vOut->pArray = pcVar4;
      vOut->nCap = (int)sVar3;
    }
  }
  else {
    pcVar4 = vOut->pArray;
  }
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  pcVar4[iVar2] = (char)((uint)Val >> 8);
  uVar1 = vOut->nSize;
  if (uVar1 == vOut->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar4;
      vOut->nCap = 0x10;
    }
    else {
      sVar3 = (ulong)uVar1 * 2;
      if (vOut->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar3);
      }
      else {
        pcVar4 = (char *)realloc(vOut->pArray,sVar3);
      }
      vOut->pArray = pcVar4;
      vOut->nCap = (int)sVar3;
    }
  }
  else {
    pcVar4 = vOut->pArray;
  }
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  pcVar4[iVar2] = (char)((uint)Val >> 0x10);
  uVar1 = vOut->nSize;
  if (uVar1 == vOut->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar4;
      vOut->nCap = 0x10;
    }
    else {
      sVar3 = (ulong)uVar1 * 2;
      if (vOut->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar3);
      }
      else {
        pcVar4 = (char *)realloc(vOut->pArray,sVar3);
      }
      vOut->pArray = pcVar4;
      vOut->nCap = (int)sVar3;
    }
  }
  else {
    pcVar4 = vOut->pArray;
  }
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  pcVar4[iVar2] = (char)((uint)Val >> 0x18);
  return;
}

Assistant:

static inline void Vec_StrPutF( Vec_Str_t * vOut, float Val )
{
    union { float num; unsigned char data[4]; } tmp;
    tmp.num = Val;
    Vec_StrPush( vOut, tmp.data[0] );
    Vec_StrPush( vOut, tmp.data[1] );
    Vec_StrPush( vOut, tmp.data[2] );
    Vec_StrPush( vOut, tmp.data[3] );
}